

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O0

void __thiscall Dialog::prepare(Dialog *this)

{
  ALLEGRO_MOUSE_STATE mst;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  Dialog *in_stack_ffffffffffffffd0;
  
  configure_all(in_stack_ffffffffffffffd0);
  al_get_mouse_state(&stack0xffffffffffffffc8);
  check_mouse_over(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void Dialog::prepare()
{
   this->configure_all();

   /* XXX this isn't working right in X.  The mouse position is reported as
    * (0,0) initially, until the mouse pointer is moved.
    */
   ALLEGRO_MOUSE_STATE mst;
   al_get_mouse_state(&mst);
   this->check_mouse_over(mst.x, mst.y);
}